

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  reference this_00;
  long *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  size_t width;
  size_t tabPos;
  string remainder;
  size_t indent;
  string wrappableChars;
  value_type *in_stack_fffffffffffffe38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  string local_168 [32];
  string local_148 [32];
  string local_128 [16];
  size_t in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  Text *in_stack_ffffffffffffff00;
  string local_e8 [32];
  ulong local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  ulong local_b0;
  long local_a8;
  undefined4 local_a0;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  allocator local_39;
  string local_38 [32];
  long *local_18;
  string *local_10;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  lVar9 = *local_18;
  lVar1 = local_18[1];
  lVar2 = local_18[3];
  *(long *)(in_RDI + 0x30) = local_18[2];
  *(long *)(in_RDI + 0x38) = lVar2;
  *(long *)(in_RDI + 0x20) = lVar9;
  *(long *)(in_RDI + 0x28) = lVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b10a3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38," [({.,/|\\-",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*local_18 == -1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18[1];
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_18;
  }
  local_58 = __rhs;
  std::__cxx11::string::string(local_78,local_10);
  do {
    bVar4 = std::__cxx11::string::empty();
    if (((bVar4 ^ 0xff) & 1) == 0) {
      local_a0 = 0;
LAB_001b1726:
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_38);
      return;
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(__lhs + 0x40));
    if (999 < sVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"... message truncated due to excessive size",&local_99)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      local_a0 = 1;
      goto LAB_001b1726;
    }
    local_a8 = -1;
    local_b8 = std::__cxx11::string::size();
    local_c0 = local_18[2] - (long)local_58;
    puVar6 = std::min<unsigned_long>(&local_b8,&local_c0);
    local_b0 = *puVar6;
    local_c8 = std::__cxx11::string::find_first_of((char)local_78,10);
    if (local_c8 <= local_b0) {
      local_b0 = local_c8;
    }
    local_c8 = std::__cxx11::string::find_last_of
                         ((char)local_78,(ulong)(uint)(int)(char)local_18[3]);
    if (local_c8 != -1) {
      local_a8 = local_c8;
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
      if (*pcVar7 == '\n') {
        local_b0 = local_b0 - 1;
      }
      std::__cxx11::string::substr((ulong)&stack0xfffffffffffffef8,(ulong)local_78);
      std::__cxx11::string::substr((ulong)local_128,(ulong)local_78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     __rhs);
      std::__cxx11::string::operator=(local_78,local_e8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    }
    uVar3 = local_b0;
    uVar8 = std::__cxx11::string::size();
    if (uVar3 == uVar8) {
      spliceLine(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
    }
    else {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
      if (*pcVar7 == '\n') {
        spliceLine(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        if ((local_b0 < 2) || (lVar9 = std::__cxx11::string::size(), lVar9 != 1)) {
          std::__cxx11::string::substr((ulong)local_148,(ulong)local_78);
          std::__cxx11::string::operator=(local_78,local_148);
          std::__cxx11::string::~string(local_148);
        }
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18[1];
      }
      else {
        local_c8 = std::__cxx11::string::find_last_of(local_78,(ulong)local_38);
        if ((local_c8 == -1) || (local_c8 == 0)) {
          spliceLine(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back(in_stack_fffffffffffffe40);
          std::__cxx11::string::operator+=((string *)this_00,"-");
        }
        else {
          spliceLine(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8);
          in_stack_fffffffffffffe40 =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::__cxx11::string::operator[]((ulong)local_78);
          if (*(char *)&(in_stack_fffffffffffffe40->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start == ' ') {
            std::__cxx11::string::substr((ulong)local_168,(ulong)local_78);
            std::__cxx11::string::operator=(local_78,local_168);
            std::__cxx11::string::~string(local_168);
          }
        }
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(__lhs + 0x40));
        if (sVar5 == 1) {
          local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_18[1];
        }
        if (local_a8 != -1) {
          local_58 = local_58 + local_a8;
        }
      }
    }
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }